

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O3

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportTestStartCapturesTestNameAndSuiteHelper>
               (DeferredTestReporterFixtureReportTestStartCapturesTestNameAndSuiteHelper *testObject
               ,TestDetails *details)

{
  pointer actual;
  TestResults *pTVar1;
  int iVar2;
  TestDetails **ppTVar3;
  DeferredTestResultList *pDVar4;
  TestResults **ppTVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  SignalTranslator sig;
  pointer local_4b8;
  TestDetails local_4b0;
  SignalTranslator local_490;
  
  ppTVar3 = CurrentTest::Details();
  *ppTVar3 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar2 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar2 == 0) {
    DeferredTestReporter::ReportTestStart
              ((DeferredTestReporter *)testObject,
               &(testObject->super_DeferredTestReporterFixture).details);
    pDVar4 = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    actual = (pDVar4->
             super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pDVar4->
        super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
        )._M_impl.super__Vector_impl_data._M_finish == actual) {
      uVar7 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0);
      __cxa_begin_catch(uVar7);
      ppTVar5 = CurrentTest::Results();
      pTVar1 = *ppTVar5;
      ppTVar3 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4b0,*ppTVar3,0x3a);
      TestResults::OnTestFailure
                (pTVar1,&local_4b0,
                 "Unhandled exception in CHECK_EQUAL(testSuite.c_str(), result.suiteName)");
      __cxa_end_catch();
    }
    else {
      ppTVar5 = CurrentTest::Results();
      pTVar1 = *ppTVar5;
      local_4b8 = (testObject->super_DeferredTestReporterFixture).testName._M_dataplus._M_p;
      ppTVar3 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4b0,*ppTVar3,0x39);
      CheckEqual<char_const*,std::__cxx11::string>(pTVar1,&local_4b8,&actual->testName,&local_4b0);
      ppTVar5 = CurrentTest::Results();
      pTVar1 = *ppTVar5;
      local_4b8 = (testObject->super_DeferredTestReporterFixture).testSuite._M_dataplus._M_p;
      ppTVar3 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4b0,*ppTVar3,0x3a);
      CheckEqual<char_const*,std::__cxx11::string>(pTVar1,&local_4b8,&actual->suiteName,&local_4b0);
    }
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Unhandled system exception";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}